

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

string_view __thiscall google::protobuf::io::Printer::Sub::value(Sub *this)

{
  LogMessage *pLVar1;
  string_view v;
  string_view sVar2;
  LogMessage local_20;
  
  if (*(__index_type *)
       ((long)&(this->value_).value.
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
       0x20) == '\0') {
    sVar2._M_str = *(char **)&(this->value_).value.
                              super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                              .
                              super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
    ;
    sVar2._M_len = *(size_t *)
                    ((long)&(this->value_).value.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + 8);
    return sVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h"
             ,0x3ea,"str != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [16])"could not find ");
  v._M_str = (this->key_)._M_dataplus._M_p;
  v._M_len = (this->key_)._M_string_length;
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (pLVar1,(char (*) [25])"; found callback instead");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

absl::string_view value() const {
    const auto* str = value_.AsString();
    ABSL_CHECK(str != nullptr)
        << "could not find " << key() << "; found callback instead";
    return *str;
  }